

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  byte *pbVar1;
  uint8 uVar2;
  int iVar3;
  void **ppvVar4;
  bool bVar5;
  uint uVar6;
  Limit limit;
  uint8 *puVar7;
  string *psVar8;
  uint8 *puVar9;
  UninterpretedOption *this_00;
  UnknownFieldSet *pUVar10;
  uint32 uVar11;
  int iVar12;
  ExtensionSet *pEVar13;
  uint32 local_4c;
  UnknownFieldSet *local_48;
  ExtensionSet *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
  pUVar10 = &this->_unknown_fields_;
  pEVar13 = &this->_extensions_;
LAB_001ed0a2:
  puVar7 = input->buffer_;
  if ((puVar7 < input->buffer_end_) && (uVar11 = (uint32)(char)*puVar7, -1 < (char)*puVar7)) {
    input->last_tag_ = uVar11;
    input->buffer_ = puVar7 + 1;
  }
  else {
    uVar11 = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = uVar11;
  }
  if (uVar11 == 0) {
    return true;
  }
  uVar6 = uVar11 & 7;
  switch(uVar11 >> 3) {
  case 1:
    if (uVar6 == 2) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      psVar8 = this->java_package_;
      if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar8 = (string *)operator_new(0x20);
        (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
        psVar8->_M_string_length = 0;
        (psVar8->field_2)._M_local_buf[0] = '\0';
        this->java_package_ = psVar8;
      }
      bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
      if (!bVar5) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->java_package_->_M_dataplus)._M_p,(int)this->java_package_->_M_string_length,
                 PARSE);
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (*puVar7 == 'B')) {
        input->buffer_ = puVar7 + 1;
LAB_001ed208:
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        psVar8 = this->java_outer_classname_;
        if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar8 = (string *)operator_new(0x20);
          (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
          psVar8->_M_string_length = 0;
          (psVar8->field_2)._M_local_buf[0] = '\0';
          this->java_outer_classname_ = psVar8;
        }
        bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
        if (!bVar5) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->java_outer_classname_->_M_dataplus)._M_p,
                   (int)this->java_outer_classname_->_M_string_length,PARSE);
        puVar7 = input->buffer_;
        puVar9 = input->buffer_end_;
        if ((puVar7 < puVar9) && (*puVar7 == 'H')) {
          puVar7 = puVar7 + 1;
          input->buffer_ = puVar7;
LAB_001ed283:
          if ((puVar7 < puVar9) && (uVar2 = *puVar7, -1 < (char)uVar2)) {
            input->buffer_ = puVar7 + 1;
            uVar11 = (int)(char)uVar2;
          }
          else {
            bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
            uVar11 = local_4c;
            if (!bVar5) {
              return false;
            }
          }
          if (uVar11 - 1 < 3) {
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x10;
            this->optimize_for_ = uVar11;
          }
          else {
            UnknownFieldSet::AddVarint(pUVar10,9,(long)(int)uVar11);
          }
          puVar7 = input->buffer_;
          puVar9 = input->buffer_end_;
          if ((puVar7 < puVar9) && (*puVar7 == 'P')) {
            puVar7 = puVar7 + 1;
            input->buffer_ = puVar7;
LAB_001ed35a:
            if ((puVar7 < puVar9) && (uVar2 = *puVar7, -1 < (char)uVar2)) {
              puVar7 = puVar7 + 1;
              input->buffer_ = puVar7;
              uVar11 = (int)(char)uVar2;
            }
            else {
              bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
              if (!bVar5) {
                return false;
              }
              puVar7 = input->buffer_;
              puVar9 = input->buffer_end_;
              uVar11 = local_4c;
            }
            this->java_multiple_files_ = uVar11 != 0;
            uVar6 = this->_has_bits_[0] | 4;
            this->_has_bits_[0] = uVar6;
            if ((puVar7 < puVar9) && (*puVar7 == 'Z')) {
              input->buffer_ = puVar7 + 1;
LAB_001ed3c1:
              this->_has_bits_[0] = uVar6 | 0x20;
              psVar8 = this->go_package_;
              if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
                psVar8 = (string *)operator_new(0x20);
                (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
                psVar8->_M_string_length = 0;
                (psVar8->field_2)._M_local_buf[0] = '\0';
                this->go_package_ = psVar8;
              }
              bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
              if (!bVar5) {
                return false;
              }
              internal::WireFormat::VerifyUTF8StringFallback
                        ((this->go_package_->_M_dataplus)._M_p,
                         (int)this->go_package_->_M_string_length,PARSE);
            }
          }
        }
      }
      goto LAB_001ed0a2;
    }
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x13:
    break;
  case 8:
    if (uVar6 == 2) goto LAB_001ed208;
    break;
  case 9:
    if (uVar6 == 0) {
      puVar7 = input->buffer_;
      puVar9 = input->buffer_end_;
      goto LAB_001ed283;
    }
    break;
  case 10:
    if (uVar6 == 0) {
      puVar7 = input->buffer_;
      puVar9 = input->buffer_end_;
      goto LAB_001ed35a;
    }
    break;
  case 0xb:
    if (uVar6 == 2) {
      uVar6 = this->_has_bits_[0];
      goto LAB_001ed3c1;
    }
    break;
  case 0x10:
    if (uVar6 != 0) break;
    puVar9 = input->buffer_;
    puVar7 = input->buffer_end_;
    if ((puVar9 < puVar7) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
      puVar9 = puVar9 + 1;
      input->buffer_ = puVar9;
      uVar11 = (int)(char)uVar2;
    }
    else {
      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
      if (!bVar5) {
        return false;
      }
      puVar9 = input->buffer_;
      puVar7 = input->buffer_end_;
      uVar11 = local_4c;
    }
    this->cc_generic_services_ = uVar11 != 0;
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
    if (((1 < (int)puVar7 - (int)puVar9) && (*puVar9 == 0x88)) && (puVar9[1] == '\x01')) {
      puVar9 = puVar9 + 2;
      input->buffer_ = puVar9;
LAB_001ed4bb:
      if ((puVar9 < puVar7) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
        puVar9 = puVar9 + 1;
        input->buffer_ = puVar9;
        uVar11 = (int)(char)uVar2;
      }
      else {
        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
        if (!bVar5) {
          return false;
        }
        puVar9 = input->buffer_;
        puVar7 = input->buffer_end_;
        uVar11 = local_4c;
      }
      this->java_generic_services_ = uVar11 != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x80;
      if (((1 < (int)puVar7 - (int)puVar9) && (*puVar9 == 0x90)) && (puVar9[1] == '\x01')) {
        puVar9 = puVar9 + 2;
        input->buffer_ = puVar9;
LAB_001ed528:
        if ((puVar9 < puVar7) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
          puVar9 = puVar9 + 1;
          input->buffer_ = puVar9;
          uVar11 = (int)(char)uVar2;
        }
        else {
          bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
          if (!bVar5) {
            return false;
          }
          puVar9 = input->buffer_;
          puVar7 = input->buffer_end_;
          uVar11 = local_4c;
        }
        this->py_generic_services_ = uVar11 != 0;
        pbVar1 = (byte *)((long)this->_has_bits_ + 1);
        *pbVar1 = *pbVar1 | 1;
        if (((1 < (int)puVar7 - (int)puVar9) && (*puVar9 == 0xa0)) && (puVar9[1] == '\x01')) {
          puVar9 = puVar9 + 2;
          input->buffer_ = puVar9;
LAB_001ed595:
          if ((puVar9 < puVar7) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
            puVar9 = puVar9 + 1;
            input->buffer_ = puVar9;
            uVar11 = (int)(char)uVar2;
          }
          else {
            bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
            if (!bVar5) {
              return false;
            }
            puVar9 = input->buffer_;
            puVar7 = input->buffer_end_;
            uVar11 = local_4c;
          }
          this->java_generate_equals_and_hash_ = uVar11 != 0;
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
          if (((1 < (int)puVar7 - (int)puVar9) && (*puVar9 == 0xba)) && (puVar9[1] == '>')) {
            do {
              input->buffer_ = puVar9 + 2;
LAB_001ed5fd:
              iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
              iVar12 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
              local_48 = pUVar10;
              local_40 = pEVar13;
              if (iVar3 < iVar12) {
                ppvVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
                (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                this_00 = (UninterpretedOption *)ppvVar4[iVar3];
              }
              else {
                if (iVar12 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
                {
                  internal::RepeatedPtrFieldBase::Reserve(local_38,iVar12 + 1);
                  iVar12 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
                }
                (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_ =
                     iVar12 + 1;
                this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New()
                ;
                ppvVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
                iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
                (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                ppvVar4[iVar3] = this_00;
              }
              puVar7 = input->buffer_;
              if ((puVar7 < input->buffer_end_) && (uVar2 = *puVar7, -1 < (char)uVar2)) {
                input->buffer_ = puVar7 + 1;
                local_4c = (int)(char)uVar2;
              }
              else {
                bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
                if (!bVar5) {
                  return false;
                }
              }
              iVar3 = input->recursion_depth_;
              input->recursion_depth_ = iVar3 + 1;
              if (input->recursion_limit_ <= iVar3) {
                return false;
              }
              limit = io::CodedInputStream::PushLimit(input,local_4c);
              bVar5 = UninterpretedOption::MergePartialFromCodedStream(this_00,input);
              if (!bVar5) {
                return false;
              }
              if (input->legitimate_message_end_ != true) {
                return false;
              }
              io::CodedInputStream::PopLimit(input,limit);
              if (0 < input->recursion_depth_) {
                input->recursion_depth_ = input->recursion_depth_ + -1;
              }
              puVar9 = input->buffer_;
              pUVar10 = local_48;
              pEVar13 = local_40;
            } while (((1 < (int)input->buffer_end_ - (int)puVar9) && (*puVar9 == 0xba)) &&
                    (puVar9[1] == '>'));
            if ((puVar9 == input->buffer_end_) &&
               ((input->buffer_size_after_limit_ != 0 ||
                (input->total_bytes_read_ == input->current_limit_)))) {
              input->last_tag_ = 0;
              input->legitimate_message_end_ = true;
              return true;
            }
          }
        }
      }
    }
    goto LAB_001ed0a2;
  case 0x11:
    if (uVar6 == 0) {
      puVar9 = input->buffer_;
      puVar7 = input->buffer_end_;
      goto LAB_001ed4bb;
    }
    break;
  case 0x12:
    if (uVar6 == 0) {
      puVar9 = input->buffer_;
      puVar7 = input->buffer_end_;
      goto LAB_001ed528;
    }
    break;
  case 0x14:
    if (uVar6 == 0) {
      puVar9 = input->buffer_;
      puVar7 = input->buffer_end_;
      goto LAB_001ed595;
    }
    break;
  default:
    if ((uVar11 >> 3 == 999) && (uVar6 == 2)) goto LAB_001ed5fd;
  }
  if (uVar6 == 4) {
    return true;
  }
  if (uVar11 < 8000) {
    bVar5 = internal::WireFormat::SkipField(input,uVar11,pUVar10);
  }
  else {
    bVar5 = internal::ExtensionSet::ParseField(pEVar13,uVar11,input,default_instance_,pUVar10);
  }
  if (bVar5 == false) {
    return false;
  }
  goto LAB_001ed0a2;
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_java_outer_classname;
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_java_outer_classname:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(72)) goto parse_optimize_for;
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_optimize_for:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_java_multiple_files;
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_multiple_files:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
          set_has_java_multiple_files();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(90)) goto parse_go_package;
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_go_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(128)) goto parse_cc_generic_services;
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_cc_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
          set_has_cc_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(136)) goto parse_java_generic_services;
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
          set_has_java_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(144)) goto parse_py_generic_services;
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_py_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
          set_has_py_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(160)) goto parse_java_generate_equals_and_hash;
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [default = false];
      case 20: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generate_equals_and_hash:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
          set_has_java_generate_equals_and_hash();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}